

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O0

bool sock_tests::SocketIsClosed(SOCKET *s)

{
  int iVar1;
  int *in_RDI;
  long in_FS_OFFSET;
  socklen_t len;
  int type;
  socklen_t local_10;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 4;
  iVar1 = getsockopt(*in_RDI,1,3,local_c,&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar1 == -1;
  }
  __stack_chk_fail();
}

Assistant:

static bool SocketIsClosed(const SOCKET& s)
{
    // Notice that if another thread is running and creates its own socket after `s` has been
    // closed, it may be assigned the same file descriptor number. In this case, our test will
    // wrongly pretend that the socket is not closed.
    int type;
    socklen_t len = sizeof(type);
    return getsockopt(s, SOL_SOCKET, SO_TYPE, (sockopt_arg_type)&type, &len) == SOCKET_ERROR;
}